

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeXMLParser.cpp
# Opt level: O2

void __thiscall xe::xml::Tokenizer::advance(Tokenizer *this)

{
  Token TVar1;
  int iVar2;
  uint uVar3;
  undefined8 uVar4;
  undefined8 extraout_RAX;
  State SVar5;
  uint uVar6;
  Tokenizer *pTVar7;
  uint uVar8;
  bool bVar9;
  allocator<char> local_51;
  string local_50;
  
  TVar1 = this->m_curToken;
  if (TVar1 < TOKEN_LAST) {
    if ((0x2a88U >> (TVar1 & 0x1f) & 1) == 0) {
      if (TVar1 == TOKEN_INCOMPLETE) {
        uVar6 = this->m_curTokenLen;
        goto LAB_0011df73;
      }
    }
    else {
      this->m_state = STATE_DATA;
    }
  }
  iVar2 = this->m_curTokenLen;
  (this->m_buf).m_back = ((this->m_buf).m_back + iVar2) % (this->m_buf).m_size;
  (this->m_buf).m_numElements = (this->m_buf).m_numElements - iVar2;
  this->m_curToken = TOKEN_INCOMPLETE;
  this->m_curTokenLen = 0;
  uVar6 = 0;
  iVar2 = getChar(this,0);
  if (iVar2 == 0) {
    uVar4 = 0x100000001;
LAB_0011df64:
    this->m_curToken = (int)uVar4;
    this->m_curTokenLen = (int)((ulong)uVar4 >> 0x20);
    return;
  }
LAB_0011df73:
  uVar3 = getChar(this,uVar6);
  while( true ) {
    SVar5 = this->m_state;
    while (SVar5 == STATE_DATA) {
      SVar5 = STATE_DATA;
      if (1 < uVar3 + 1) {
        SVar5 = STATE_TAG;
        if (uVar3 != 0x3c) {
          if (uVar3 != 0x26) goto LAB_0011e14a;
          SVar5 = STATE_ENTITY;
        }
        this->m_state = SVar5;
      }
      if (0 < (int)uVar6) {
        this->m_curToken = TOKEN_DATA;
        return;
      }
      if (uVar3 + 1 < 2) {
        return;
      }
    }
    if (uVar6 == 0) {
      while ((uVar3 < 0x21 && ((0x100002600U >> ((ulong)uVar3 & 0x3f) & 1) != 0))) {
        de::RingBuffer<unsigned_char>::popBack(&this->m_buf);
        uVar3 = getChar(this,0);
      }
    }
    if (uVar3 == 0xffffffff) {
      return;
    }
    if (uVar3 == 0) break;
    uVar8 = this->m_curTokenLen;
    if (uVar8 == 0) {
      uVar8 = 0;
      if ((uVar3 == 0x22) || (uVar3 == 0x27)) {
        SVar5 = STATE_VALUE;
      }
      else {
        SVar5 = STATE_IDENTIFIER;
        if (0x19 < (uVar3 & 0xffffffdf) - 0x41) {
          uVar8 = 0;
          SVar5 = STATE_TAG;
          switch(uVar3) {
          case 0x3c:
          case 0x3f:
            break;
          case 0x3d:
            uVar4 = 0x10000000c;
            goto LAB_0011df64;
          case 0x3e:
            uVar4 = 0x100000007;
            goto LAB_0011df64;
          default:
            if (uVar3 == 0x26) {
              uVar6 = 0;
              goto LAB_0011e14a;
            }
            SVar5 = STATE_TAG;
            if (uVar3 != 0x2f) goto LAB_0011e338;
          }
        }
      }
switchD_0011e11f_caseD_3c:
      this->m_state = SVar5;
      uVar6 = uVar8;
    }
    else {
      uVar6 = uVar8;
      switch(this->m_state) {
      case STATE_IDENTIFIER:
        if ((((9 < uVar3 - 0x30) && (0x19 < (uVar3 & 0xffffffdf) - 0x41)) && (uVar3 != 0x2d)) &&
           (uVar3 != 0x5f)) {
          this->m_curToken = TOKEN_IDENTIFIER;
          return;
        }
        break;
      case STATE_VALUE:
        if ((uVar3 == 0x27) || (uVar3 == 0x22)) {
          uVar6 = getChar(this,0);
          if (uVar3 == uVar6) {
            this->m_curToken = TOKEN_STRING;
            goto LAB_0011e283;
          }
          goto LAB_0011e358;
        }
        break;
      case STATE_COMMENT:
        if ((int)uVar8 < 4) {
          if (uVar3 != 0x2d) goto LAB_0011e318;
        }
        else {
          if (uVar8 < 6) {
            uVar6 = 4;
            if (uVar8 == 4) break;
            bVar9 = false;
          }
          else {
            iVar2 = getChar(this,uVar8 - 2);
            bVar9 = iVar2 == 0x2d;
          }
          iVar2 = getChar(this,uVar8 - 1);
          uVar6 = uVar8;
          if ((bVar9) && (iVar2 == 0x2d)) {
            if (uVar3 == 0x3e) {
              this->m_curToken = TOKEN_COMMENT;
LAB_0011e283:
              this->m_curTokenLen = uVar8 + 1;
              return;
            }
            goto LAB_0011e3b8;
          }
        }
        break;
      case STATE_ENTITY:
        if (0 < (int)uVar8) {
          if (uVar3 == 0x3b) {
            this->m_curToken = TOKEN_ENTITY;
            goto LAB_0011e283;
          }
          if ((9 < uVar3 - 0x30) && (0x19 < (uVar3 & 0xffffffdf) - 0x41)) goto LAB_0011e2f8;
        }
        break;
      default:
        iVar2 = getChar(this,uVar8 - 1);
        if (iVar2 == 0x3c) {
          SVar5 = STATE_COMMENT;
          if (uVar3 == 0x21) goto switchD_0011e11f_caseD_3c;
          if (uVar3 == 0x3f) {
            uVar4 = 0x20000000a;
          }
          else if (uVar3 == 0x2f) {
            uVar4 = 0x200000008;
          }
          else {
            uVar4 = 0x100000006;
          }
          goto LAB_0011df64;
        }
        if (iVar2 == 0x2f) {
          if (uVar3 != 0x3e) goto LAB_0011e398;
          uVar4 = 0x200000009;
        }
        else {
          if (iVar2 != 0x3f) goto LAB_0011e2d8;
          if (uVar3 != 0x3e) goto LAB_0011e378;
          uVar4 = 0x20000000b;
        }
        goto LAB_0011df64;
      }
    }
LAB_0011e14a:
    uVar6 = uVar6 + 1;
    this->m_curTokenLen = uVar6;
    uVar3 = getChar(this,uVar6);
  }
  pTVar7 = (Tokenizer *)&local_50;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)pTVar7,"Unexpected end of string",&local_51);
  error(pTVar7,&local_50);
LAB_0011e2d8:
  pTVar7 = (Tokenizer *)&local_50;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)pTVar7,"Could not parse special token",&local_51);
  error(pTVar7,&local_50);
LAB_0011e2f8:
  pTVar7 = (Tokenizer *)&local_50;
  std::__cxx11::string::string<std::allocator<char>>((string *)pTVar7,"Invalid entity",&local_51);
  error(pTVar7,&local_50);
LAB_0011e318:
  pTVar7 = (Tokenizer *)&local_50;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)pTVar7,"Invalid comment start",&local_51);
  error(pTVar7,&local_50);
LAB_0011e338:
  pTVar7 = (Tokenizer *)&local_50;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)pTVar7,"Unexpected character",&local_51);
  error(pTVar7,&local_50);
LAB_0011e358:
  pTVar7 = (Tokenizer *)&local_50;
  std::__cxx11::string::string<std::allocator<char>>((string *)pTVar7,"Mismatched quote",&local_51);
  error(pTVar7,&local_50);
LAB_0011e378:
  pTVar7 = (Tokenizer *)&local_50;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)pTVar7,"Invalid processing instruction end",&local_51);
  error(pTVar7,&local_50);
LAB_0011e398:
  pTVar7 = (Tokenizer *)&local_50;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)pTVar7,"Invalid empty element end",&local_51);
  error(pTVar7,&local_50);
LAB_0011e3b8:
  pTVar7 = (Tokenizer *)&local_50;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)pTVar7,"Invalid comment end",&local_51);
  error(pTVar7,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void Tokenizer::advance (void)
{
	if (m_curToken != TOKEN_INCOMPLETE)
	{
		// Parser should not try to advance beyond end of string.
		DE_ASSERT(m_curToken != TOKEN_END_OF_STRING);

		// If current token is tag end, change state to data.
		if (m_curToken == TOKEN_TAG_END						||
			m_curToken == TOKEN_EMPTY_ELEMENT_END			||
			m_curToken == TOKEN_PROCESSING_INSTRUCTION_END	||
			m_curToken == TOKEN_COMMENT						||
			m_curToken == TOKEN_ENTITY)
			m_state = STATE_DATA;

		// Advance buffer by length of last token.
		m_buf.popBack(m_curTokenLen);

		// Reset state.
		m_curToken		= TOKEN_INCOMPLETE;
		m_curTokenLen	= 0;

		// If we hit end of string here, report it as end of string.
		if (getChar(0) == END_OF_STRING)
		{
			m_curToken		= TOKEN_END_OF_STRING;
			m_curTokenLen	= 1;
			return;
		}
	}

	int curChar = getChar(m_curTokenLen);

	for (;;)
	{
		if (m_state == STATE_DATA)
		{
			// Advance until we hit end of buffer or tag start and treat that as data token.
			if (curChar == END_OF_STRING || curChar == (int)END_OF_BUFFER || curChar == '<' || curChar == '&')
			{
				if (curChar == '<')
					m_state = STATE_TAG;
				else if (curChar == '&')
					m_state = STATE_ENTITY;

				if (m_curTokenLen > 0)
				{
					// Report data token.
					m_curToken = TOKEN_DATA;
					return;
				}
				else if (curChar == END_OF_STRING || curChar == (int)END_OF_BUFFER)
				{
					// Just return incomplete token, no data parsed.
					return;
				}
				else
				{
					DE_ASSERT(m_state == STATE_TAG || m_state == STATE_ENTITY);
					continue;
				}
			}
		}
		else
		{
			// Eat all whitespace if present.
			if (m_curTokenLen == 0)
			{
				while (isWhitespaceChar(curChar))
				{
					m_buf.popBack();
					curChar = getChar(0);
				}
			}

			// Handle end of string / buffer.
			if (curChar == END_OF_STRING)
				error("Unexpected end of string");
			else if (curChar == (int)END_OF_BUFFER)
			{
				DE_ASSERT(m_curToken == TOKEN_INCOMPLETE);
				return;
			}

			if (m_curTokenLen == 0)
			{
				// Expect start of identifier, value or special tag token.
				if (curChar == '\'' || curChar == '"')
					m_state = STATE_VALUE;
				else if (isIdentifierStartChar(curChar))
					m_state = STATE_IDENTIFIER;
				else if (curChar == '<' || curChar == '?' || curChar == '/')
					m_state = STATE_TAG;
				else if (curChar == '&')
					DE_ASSERT(m_state == STATE_ENTITY);
				else if (curChar == '=')
				{
					m_curToken		= TOKEN_EQUAL;
					m_curTokenLen	= 1;
					return;
				}
				else if (curChar == '>')
				{
					m_curToken		= TOKEN_TAG_END;
					m_curTokenLen	= 1;
					return;
				}
				else
					error("Unexpected character");
			}
			else if (m_state == STATE_IDENTIFIER)
			{
				if (!isIdentifierChar(curChar))
				{
					m_curToken = TOKEN_IDENTIFIER;
					return;
				}
			}
			else if (m_state == STATE_VALUE)
			{
				// \todo [2012-06-07 pyry] Escapes.
				if (curChar == '\'' || curChar == '"')
				{
					// \todo [2012-10-17 pyry] Should we actually do the check against getChar(0)?
					if (curChar != getChar(0))
						error("Mismatched quote");
					m_curToken		 = TOKEN_STRING;
					m_curTokenLen	+= 1;
					return;
				}
			}
			else if (m_state == STATE_COMMENT)
			{
				DE_ASSERT(m_curTokenLen >= 2); // 2 characters have been parsed if we are in comment state.

				if (m_curTokenLen <= 3)
				{
					if (curChar != '-')
						error("Invalid comment start");
				}
				else
				{
					int prev2 = m_curTokenLen > 5 ? getChar(m_curTokenLen-2) : 0;
					int prev1 = m_curTokenLen > 4 ? getChar(m_curTokenLen-1) : 0;

					if (prev2 == '-' && prev1 == '-')
					{
						if (curChar != '>')
							error("Invalid comment end");
						m_curToken		 = TOKEN_COMMENT;
						m_curTokenLen	+= 1;
						return;
					}
				}
			}
			else if (m_state == STATE_ENTITY)
			{
				if (m_curTokenLen >= 1)
				{
					if (curChar == ';')
					{
						m_curToken		 = TOKEN_ENTITY;
						m_curTokenLen	+= 1;
						return;
					}
					else if (!de::inRange<int>(curChar, '0', '9')	&&
							 !de::inRange<int>(curChar, 'a', 'z')	&&
							 !de::inRange<int>(curChar, 'A', 'Z'))
						error("Invalid entity");
				}
			}
			else
			{
				// Special tokens are at most 2 characters.
				DE_ASSERT(m_state == STATE_TAG && m_curTokenLen == 1);

				int prevChar = getChar(m_curTokenLen-1);

				if (prevChar == '<')
				{
					// Tag start.
					if (curChar == '/')
					{
						m_curToken		= TOKEN_END_TAG_START;
						m_curTokenLen	= 2;
						return;
					}
					else if (curChar == '?')
					{
						m_curToken		= TOKEN_PROCESSING_INSTRUCTION_START;
						m_curTokenLen	= 2;
						return;
					}
					else if (curChar == '!')
					{
						m_state = STATE_COMMENT;
					}
					else
					{
						m_curToken		= TOKEN_TAG_START;
						m_curTokenLen	= 1;
						return;
					}
				}
				else if (prevChar == '?')
				{
					if (curChar != '>')
						error("Invalid processing instruction end");
					m_curToken		= TOKEN_PROCESSING_INSTRUCTION_END;
					m_curTokenLen	= 2;
					return;
				}
				else if (prevChar == '/')
				{
					if (curChar != '>')
						error("Invalid empty element end");
					m_curToken		= TOKEN_EMPTY_ELEMENT_END;
					m_curTokenLen	= 2;
					return;
				}
				else
					error("Could not parse special token");
			}
		}

		m_curTokenLen	+= 1;
		curChar			 = getChar(m_curTokenLen);
	}
}